

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

Table * sqlite3FindTable(sqlite3 *db,char *zName,char *zDatabase)

{
  long *plVar1;
  int iVar2;
  Table *pTVar3;
  ulong uVar4;
  char *pcVar5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  Db *pDVar9;
  ulong uVar10;
  
  if (zDatabase == (char *)0x0) {
    pTVar3 = (Table *)sqlite3HashFind(&(db->aDb[1].pSchema)->tblHash,zName);
    if (pTVar3 != (Table *)0x0) {
      return pTVar3;
    }
    pTVar3 = (Table *)sqlite3HashFind(&db->aDb->pSchema->tblHash,zName);
    if (pTVar3 != (Table *)0x0) {
      return pTVar3;
    }
    lVar6 = 0x58;
    lVar8 = 1;
    while (lVar8 = lVar8 + 1, lVar8 < db->nDb) {
      plVar1 = (long *)((long)&db->aDb->zDbSName + lVar6);
      lVar6 = lVar6 + 0x20;
      pTVar3 = (Table *)sqlite3HashFind((Hash *)(*plVar1 + 8),zName);
      if (pTVar3 != (Table *)0x0) {
        return pTVar3;
      }
    }
    iVar2 = sqlite3_strnicmp(zName,"sqlite_",7);
    if (iVar2 != 0) {
      return (Table *)0x0;
    }
    iVar2 = sqlite3StrICmp(zName + 7,"schema");
    if (iVar2 != 0) {
      pcVar5 = "sqlite_temp_schema";
LAB_0012c58b:
      iVar2 = sqlite3StrICmp(zName + 7,pcVar5 + 7);
      if (iVar2 != 0) {
        return (Table *)0x0;
      }
      goto LAB_0012c598;
    }
    pDVar9 = db->aDb;
  }
  else {
    uVar4 = 0;
    uVar7 = (ulong)(uint)db->nDb;
    if (db->nDb < 1) {
      uVar7 = uVar4;
    }
    for (uVar10 = 0; uVar7 != uVar10; uVar10 = uVar10 + 1) {
      pDVar9 = db->aDb;
      iVar2 = sqlite3StrICmp(zDatabase,*(char **)(uVar4 + (long)&pDVar9->zDbSName));
      if (iVar2 == 0) goto LAB_0012c4a4;
      uVar4 = uVar4 + 0x20;
    }
    iVar2 = sqlite3StrICmp(zDatabase,"main");
    uVar10 = 0;
    if (iVar2 != 0) {
      return (Table *)0x0;
    }
    pDVar9 = db->aDb;
LAB_0012c4a4:
    pTVar3 = (Table *)sqlite3HashFind(&(pDVar9[uVar10 & 0xffffffff].pSchema)->tblHash,zName);
    if (pTVar3 != (Table *)0x0) {
      return pTVar3;
    }
    iVar2 = sqlite3_strnicmp(zName,"sqlite_",7);
    if (iVar2 != 0) {
      return (Table *)0x0;
    }
    pcVar5 = zName + 7;
    if ((int)uVar10 == 1) {
      iVar2 = sqlite3StrICmp(pcVar5,"temp_schema");
      if ((iVar2 != 0) && (iVar2 = sqlite3StrICmp(pcVar5,"schema"), iVar2 != 0)) {
        pcVar5 = "sqlite_master";
        goto LAB_0012c58b;
      }
LAB_0012c598:
      pDVar9 = db->aDb + 1;
      pcVar5 = "sqlite_temp_master";
      goto LAB_0012c5b8;
    }
    iVar2 = sqlite3StrICmp(pcVar5,"schema");
    if (iVar2 != 0) {
      return (Table *)0x0;
    }
    pDVar9 = db->aDb + (uVar10 & 0xffffffff);
  }
  pcVar5 = "sqlite_master";
LAB_0012c5b8:
  pTVar3 = (Table *)sqlite3HashFind(&pDVar9->pSchema->tblHash,pcVar5);
  return pTVar3;
}

Assistant:

SQLITE_PRIVATE Table *sqlite3FindTable(sqlite3 *db, const char *zName, const char *zDatabase){
  Table *p = 0;
  int i;

  /* All mutexes are required for schema access.  Make sure we hold them. */
  assert( zDatabase!=0 || sqlite3BtreeHoldsAllMutexes(db) );
  if( zDatabase ){
    for(i=0; i<db->nDb; i++){
      if( sqlite3StrICmp(zDatabase, db->aDb[i].zDbSName)==0 ) break;
    }
    if( i>=db->nDb ){
      /* No match against the official names.  But always match "main"
      ** to schema 0 as a legacy fallback. */
      if( sqlite3StrICmp(zDatabase,"main")==0 ){
        i = 0;
      }else{
        return 0;
      }
    }
    p = sqlite3HashFind(&db->aDb[i].pSchema->tblHash, zName);
    if( p==0 && sqlite3StrNICmp(zName, "sqlite_", 7)==0 ){
      if( i==1 ){
        if( sqlite3StrICmp(zName+7, &PREFERRED_TEMP_SCHEMA_TABLE[7])==0
         || sqlite3StrICmp(zName+7, &PREFERRED_SCHEMA_TABLE[7])==0
         || sqlite3StrICmp(zName+7, &LEGACY_SCHEMA_TABLE[7])==0
        ){
          p = sqlite3HashFind(&db->aDb[1].pSchema->tblHash,
                              LEGACY_TEMP_SCHEMA_TABLE);
        }
      }else{
        if( sqlite3StrICmp(zName+7, &PREFERRED_SCHEMA_TABLE[7])==0 ){
          p = sqlite3HashFind(&db->aDb[i].pSchema->tblHash,
                              LEGACY_SCHEMA_TABLE);
        }
      }
    }
  }else{
    /* Match against TEMP first */
    p = sqlite3HashFind(&db->aDb[1].pSchema->tblHash, zName);
    if( p ) return p;
    /* The main database is second */
    p = sqlite3HashFind(&db->aDb[0].pSchema->tblHash, zName);
    if( p ) return p;
    /* Attached databases are in order of attachment */
    for(i=2; i<db->nDb; i++){
      assert( sqlite3SchemaMutexHeld(db, i, 0) );
      p = sqlite3HashFind(&db->aDb[i].pSchema->tblHash, zName);
      if( p ) break;
    }
    if( p==0 && sqlite3StrNICmp(zName, "sqlite_", 7)==0 ){
      if( sqlite3StrICmp(zName+7, &PREFERRED_SCHEMA_TABLE[7])==0 ){
        p = sqlite3HashFind(&db->aDb[0].pSchema->tblHash, LEGACY_SCHEMA_TABLE);
      }else if( sqlite3StrICmp(zName+7, &PREFERRED_TEMP_SCHEMA_TABLE[7])==0 ){
        p = sqlite3HashFind(&db->aDb[1].pSchema->tblHash,
                            LEGACY_TEMP_SCHEMA_TABLE);
      }
    }
  }
  return p;
}